

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_junit_xml_tests.cpp
# Opt level: O2

void __thiscall iu_Test_x_iutest_x_Fail_Test::Body(iu_Test_x_iutest_x_Fail_Test *this)

{
  int *in_R9;
  iuCodeMessage local_1f0;
  AssertionResult iutest_ar;
  Fixed local_198;
  
  memset(&local_198,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1f0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
             ,0x2f,"Succeeded.\n");
  local_1f0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
  std::__cxx11::string::~string((string *)&local_1f0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)&local_198);
  local_198.super_Message.m_stream.super_iu_stringstream._0_4_ = 2;
  local_1f0.m_message._M_dataplus._M_p._0_4_ = 3;
  iutest::internal::CmpHelperEQ<int,int>
            (&iutest_ar,(internal *)"2","3",(char *)&local_198,(int *)&local_1f0,in_R9);
  if (iutest_ar.m_result == false) {
    memset(&local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1f0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_junit_xml_tests.cpp"
               ,0x30,iutest_ar.m_message._M_dataplus._M_p);
    local_1f0._44_4_ = 2;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1f0,&local_198);
    std::__cxx11::string::~string((string *)&local_1f0);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)&local_198);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST(Test, Fail)
{
    IUTEST_SUCCEED();
    IUTEST_ASSERT_EQ(2, 3);
}